

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5HashClear(Fts5Hash *pHash)

{
  Fts5HashEntry *pFVar1;
  Fts5HashEntry *local_28;
  Fts5HashEntry *pSlot;
  Fts5HashEntry *pNext;
  int i;
  Fts5Hash *pHash_local;
  
  for (pNext._4_4_ = 0; pNext._4_4_ < pHash->nSlot; pNext._4_4_ = pNext._4_4_ + 1) {
    local_28 = pHash->aSlot[pNext._4_4_];
    while (local_28 != (Fts5HashEntry *)0x0) {
      pFVar1 = local_28->pHashNext;
      sqlite3_free(local_28);
      local_28 = pFVar1;
    }
  }
  memset(pHash->aSlot,0,(long)pHash->nSlot << 3);
  pHash->nEntry = 0;
  return;
}

Assistant:

static void sqlite3Fts5HashClear(Fts5Hash *pHash){
  int i;
  for(i=0; i<pHash->nSlot; i++){
    Fts5HashEntry *pNext;
    Fts5HashEntry *pSlot;
    for(pSlot=pHash->aSlot[i]; pSlot; pSlot=pNext){
      pNext = pSlot->pHashNext;
      sqlite3_free(pSlot);
    }
  }
  memset(pHash->aSlot, 0, pHash->nSlot * sizeof(Fts5HashEntry*));
  pHash->nEntry = 0;
}